

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O1

bool __thiscall QAccessibleAbstractScrollArea::isValid(QAccessibleAbstractScrollArea *this)

{
  bool bVar1;
  long lVar2;
  QAbstractScrollArea *this_00;
  QWidget *pQVar3;
  
  bVar1 = QAccessibleWidget::isValid(&this->super_QAccessibleWidget);
  if ((bVar1) &&
     (lVar2 = (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this), lVar2 != 0)) {
    this_00 = (QAbstractScrollArea *)
              (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    pQVar3 = QAbstractScrollArea::viewport(this_00);
    return pQVar3 != (QWidget *)0x0;
  }
  return false;
}

Assistant:

bool QAccessibleAbstractScrollArea::isValid() const
{
    return (QAccessibleWidget::isValid() && abstractScrollArea() && abstractScrollArea()->viewport());
}